

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

Status __thiscall
google::protobuf::json_internal::anon_unknown_5::
ParseMessage<google::protobuf::json_internal::ParseProto2Descriptor>
          (anon_unknown_5 *this,JsonLexer *lex,
          Desc<google::protobuf::json_internal::ParseProto2Descriptor> *desc,
          Msg<google::protobuf::json_internal::ParseProto2Descriptor> *msg,bool any_reparse)

{
  JsonLocation *pJVar1;
  int *piVar2;
  byte bVar3;
  size_t __n;
  iterator iVar4;
  size_t sVar5;
  char *pcVar6;
  pointer pcVar7;
  undefined1 auVar8 [8];
  anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
  aVar9;
  BufferingGuard BVar10;
  bool bVar11;
  char cVar12;
  bool bVar13;
  MessageType MVar14;
  int iVar15;
  string *psVar16;
  _Storage<const_google::protobuf::FieldDescriptor_*,_true> _Var17;
  Field pFVar18;
  undefined8 uVar19;
  char *pcVar20;
  uint uVar21;
  Status *_status;
  undefined4 uVar22;
  DescriptorPool *this_00;
  pointer __s1;
  undefined7 in_register_00000081;
  pointer *ppCVar23;
  MessagePath *pMVar24;
  string_view literal;
  string_view name;
  string_view literal_00;
  string_view literal_01;
  string_view literal_02;
  string_view literal_03;
  string_view literal_04;
  StatusOr<google::protobuf::json_internal::JsonLexer::Kind> SVar25;
  optional<const_google::protobuf::FieldDescriptor_*> oVar26;
  string_view sVar27;
  string_view name_00;
  string_view x;
  string_view x_00;
  StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
  key;
  ArrayInputStream in;
  optional<google::protobuf::json_internal::MaybeOwnedString> type_url;
  string_view extn_name;
  LocationWith<google::protobuf::json_internal::Mark> mark;
  string_view correct_type_name;
  bool local_1d1;
  char *local_1c0;
  undefined1 local_1b0 [8];
  undefined1 auStack_1a8 [88];
  size_t local_150;
  size_t sStack_148;
  undefined4 local_140;
  undefined4 uStack_13c;
  MessagePath *pMStack_138;
  MessagePath *local_130;
  anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
  local_128;
  undefined1 auStack_120 [16];
  code *pcStack_110;
  undefined8 local_108;
  undefined4 uStack_100;
  undefined4 uStack_fc;
  undefined1 local_f0 [32];
  Desc *local_d0;
  int local_c4;
  undefined1 local_c0 [16];
  undefined1 local_b0 [32];
  bool local_90;
  MessagePath *local_88;
  char *local_80;
  LocationWith<google::protobuf::json_internal::Mark> local_78;
  _Storage<const_google::protobuf::FieldDescriptor_*,_true> local_48;
  size_t local_40;
  pointer local_38;
  
  sVar27._M_str = (char *)desc;
  sVar27._M_len = (size_t)desc->all_names_[1]._M_dataplus._M_p;
  pcVar20 = (char *)CONCAT71(in_register_00000081,any_reparse);
  MVar14 = ClassifyMessage((json_internal *)desc->all_names_[1]._M_string_length,sVar27);
  local_c4 = (int)(char *)CONCAT71(in_register_00000081,any_reparse);
  if (local_c4 != 0) {
switchD_002c3056_caseD_3:
    JsonLexer::Expect((JsonLexer *)this,lex,1,"{");
    if (*(long *)this != 1) {
      return (Status)(uintptr_t)this;
    }
    iVar15 = (lex->options_).recursion_depth;
    if (iVar15 == 0) {
      JsonLocation::Invalid
                ((JsonLocation *)this,&lex->json_loc_,0x22,"JSON content was too deeply nested");
    }
    else {
      (lex->options_).recursion_depth = iVar15 + -1;
      *(undefined8 *)this = 1;
    }
    if (*(long *)this != 1) {
      return (Status)(uintptr_t)this;
    }
    literal._M_str = "}";
    literal._M_len = 1;
    bVar11 = JsonLexer::Peek(lex,literal);
    if (bVar11) {
      piVar2 = &(lex->options_).recursion_depth;
      *piVar2 = *piVar2 + 1;
LAB_002c30bd:
      *(undefined8 *)this = 1;
      return (Status)(uintptr_t)this;
    }
    pJVar1 = &lex->json_loc_;
    local_1d1 = true;
LAB_002c30e4:
    if (local_1d1 == false) {
      pcVar20 = "expected \',\'";
      goto LAB_002c373e;
    }
    JsonLexer::SkipToToken((JsonLexer *)this);
    if (*(long *)this != 1) {
      return (Status)(uintptr_t)this;
    }
    absl::lts_20240722::
    StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
    ::StatusOr((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                *)local_1b0);
    cVar12 = ZeroCopyBufferedStream::PeekChar(&lex->stream_);
    if ((cVar12 == '\"') ||
       (cVar12 = ZeroCopyBufferedStream::PeekChar(&lex->stream_), cVar12 == '\'')) {
      JsonLexer::ParseUtf8
                ((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                  *)&local_128.status_,lex);
      absl::lts_20240722::internal_statusor::
      StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
      ::operator=((StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                   *)local_1b0,
                  (StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                   *)&local_128.status_);
LAB_002c3149:
      absl::lts_20240722::internal_statusor::
      StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
      ::~StatusOrData((StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                       *)&local_128.status_);
      *(undefined1 (*) [8])this = local_1b0;
      if (((ulong)local_1b0 & 1) == 0) {
        LOCK();
        *(int *)local_1b0 = *(int *)local_1b0 + 1;
        UNLOCK();
      }
      if (*(long *)this != 1) {
        bVar11 = false;
        goto LAB_002c3642;
      }
      pcVar20 = ":";
      JsonLexer::Expect((JsonLexer *)this,lex,1);
      if (*(long *)this == 1) {
        if ((anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
             )local_1b0 ==
            (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
             )0x1) {
          if ((char)local_c4 == '\0') {
LAB_002c3264:
            psVar16 = MaybeOwnedString::ToString_abi_cxx11_((MaybeOwnedString *)auStack_1a8);
            local_78.value.guard_.owner_ = (ZeroCopyBufferedStream *)(psVar16->_M_dataplus)._M_p;
            local_78.value.offset_ = psVar16->_M_string_length;
            if ((((Desc *)local_78.value.offset_ == (Desc *)0x0) ||
                (*(char *)&(local_78.value.guard_.owner_)->stream_ != '[')) ||
               (((undefined1 *)
                ((long)&local_78.value.guard_.owner_[-1].outstanding_buffer_borrows_ + 3))
                [local_78.value.offset_] != ']')) {
              name_00._M_str = pcVar20;
              name_00._M_len = (size_t)local_78.value.guard_.owner_;
              oVar26 = Proto2Descriptor::FieldByName
                                 ((Proto2Descriptor *)desc,(Desc *)local_78.value.offset_,name_00);
              _Var17 = oVar26.
                       super__Optional_base<const_google::protobuf::FieldDescriptor_*,_true,_true>.
                       _M_payload.
                       super__Optional_payload_base<const_google::protobuf::FieldDescriptor_*>.
                       _M_payload;
              uVar21 = oVar26.
                       super__Optional_base<const_google::protobuf::FieldDescriptor_*,_true,_true>.
                       _M_payload.
                       super__Optional_payload_base<const_google::protobuf::FieldDescriptor_*>._8_4_
              ;
            }
            else {
              pMVar24 = (MessagePath *)
                        ((long)&((Desc *)(local_78.value.offset_ + -0x98))->reserved_name_count_ + 2
                        );
              local_88 = (MessagePath *)
                         ((long)&((Desc *)(local_78.value.offset_ + -0x98))->reserved_name_count_ +
                         3);
              if (pMVar24 <= local_88) {
                local_88 = pMVar24;
              }
              local_80 = (char *)((long)&(local_78.value.guard_.owner_)->stream_ + 1);
              this_00 = desc->file_->pool_;
              name._M_str = local_80;
              name._M_len = (size_t)local_88;
              _Var17._M_value = DescriptorPool::FindExtensionByName(this_00,name);
              uVar21 = (uint)(_Var17._M_value != (FieldDescriptor *)0x0);
              if (_Var17._M_value != (FieldDescriptor *)0x0) {
                local_38 = desc->all_names_[1]._M_dataplus._M_p;
                local_40 = desc->all_names_[1]._M_string_length;
                psVar16 = (_Var17._M_value)->containing_type_->all_names_;
                __n = psVar16[1]._M_string_length;
                uVar22 = (undefined4)CONCAT71((int7)((ulong)this_00 >> 8),1);
                if (__n == local_40) {
                  if (__n == 0) {
                    uVar22 = 0;
                  }
                  else {
                    __s1 = psVar16[1]._M_dataplus._M_p;
                    iVar15 = bcmp(__s1,local_38,__n);
                    uVar22 = (undefined4)CONCAT71((int7)((ulong)__s1 >> 8),iVar15 != 0);
                  }
                }
                if ((char)uVar22 != '\0') {
                  local_d0 = (Desc *)CONCAT44(local_d0._4_4_,uVar22);
                  local_128 = (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
                               )&local_88;
                  auStack_120._8_8_ = &local_40;
                  auStack_120._0_8_ =
                       absl::lts_20240722::str_format_internal::FormatArgImpl::
                       Dispatch<std::basic_string_view<char,std::char_traits<char>>>;
                  pcStack_110 = absl::lts_20240722::str_format_internal::FormatArgImpl::
                                Dispatch<std::basic_string_view<char,std::char_traits<char>>>;
                  absl::lts_20240722::str_format_internal::FormatPack_abi_cxx11_
                            (local_c0,
                             "\'%s\' is a known extension name, but is not an extension of \'%s\' as expected"
                             ,0x4b,&local_128);
                  JsonLocation::Invalid((JsonLocation *)this,pJVar1,local_c0._8_8_,local_c0._0_8_);
                  if ((LocationWith<google::protobuf::json_internal::Mark> *)local_c0._0_8_ !=
                      (LocationWith<google::protobuf::json_internal::Mark> *)local_b0) {
                    operator_delete((void *)local_c0._0_8_,local_b0._0_8_ + 1);
                  }
                  if ((char)local_d0 != '\0') goto LAB_002c3614;
                }
              }
            }
            BVar10.owner_ = local_78.value.guard_.owner_;
            if ((uVar21 & 1) == 0) {
              if ((lex->options_).ignore_unknown_fields == false) {
                local_c0._0_8_ = &local_78;
                local_c0._8_8_ =
                     absl::lts_20240722::str_format_internal::FormatArgImpl::
                     Dispatch<std::basic_string_view<char,std::char_traits<char>>>;
                absl::lts_20240722::str_format_internal::FormatPack_abi_cxx11_
                          (&local_128,"no such field: \'%s\'",0x13,local_c0);
                JsonLocation::Invalid((JsonLocation *)this,pJVar1,auStack_120._0_8_,local_128);
                if (local_128 !=
                    (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
                     )((long)auStack_120 + 8)) {
                  operator_delete((void *)local_128,(ulong)(auStack_120._8_8_ + 1));
                }
              }
              else {
                JsonLexer::SkipValue((JsonLexer *)this);
              }
            }
            else {
              pMVar24 = lex->path_;
              local_d0 = (Desc *)local_78.value.offset_;
              bVar3 = (_Var17._M_value)->type_;
              local_48 = _Var17;
              auStack_120 = (undefined1  [16])Proto2Descriptor::FieldTypeName(_Var17._M_value);
              aVar9 = local_128;
              local_128.status_.rep_._1_3_ = 0;
              local_128.status_.rep_._0_1_ = bVar3;
              local_128.status_.rep_._4_4_ = aVar9._4_4_;
              pcStack_110 = (code *)local_d0;
              local_108 = BVar10.owner_;
              uStack_100._0_1_ = 0xff;
              uStack_100._1_3_ = 0xffffff;
              iVar4._M_current =
                   (pMVar24->components_).
                   super__Vector_base<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              if (iVar4._M_current ==
                  (pMVar24->components_).
                  super__Vector_base<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::
                vector<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
                ::_M_realloc_insert<google::protobuf::json_internal::MessagePath::Component>
                          (&pMVar24->components_,iVar4,(Component *)&local_128.status_);
              }
              else {
                ((iVar4._M_current)->field_name)._M_str = (char *)BVar10.owner_;
                *(ulong *)&(iVar4._M_current)->repeated_index = CONCAT44(uStack_fc,0xffffffff);
                ((iVar4._M_current)->type_name)._M_str = (char *)auStack_120._8_8_;
                ((iVar4._M_current)->field_name)._M_len = (size_t)local_d0;
                *(anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
                  *)iVar4._M_current = local_128;
                ((iVar4._M_current)->type_name)._M_len = auStack_120._0_8_;
                ppCVar23 = &(pMVar24->components_).
                            super__Vector_base<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
                *ppCVar23 = *ppCVar23 + 1;
              }
              _Var17 = local_48;
              bVar11 = ParseProto2Descriptor::HasParsed
                                 (local_48._M_value,msg,(lex->options_).allow_legacy_syntax);
              if ((!bVar11) || (bVar11 = JsonLexer::Peek(lex,kNull), bVar11)) {
                if (((_Var17._M_value)->type_ == '\v') &&
                   (bVar11 = FieldDescriptor::is_map_message_type(_Var17._M_value), bVar11)) {
                  ParseMap<google::protobuf::json_internal::ParseProto2Descriptor>
                            ((JsonLexer *)this,
                             (Field<google::protobuf::json_internal::ParseProto2Descriptor>)lex,
                             (Msg<google::protobuf::json_internal::ParseProto2Descriptor> *)
                             _Var17._M_value);
                }
                else {
                  bVar11 = Proto2Descriptor::IsRepeated(_Var17._M_value);
                  if ((bVar11) &&
                     (((lex->options_).allow_legacy_syntax != true ||
                      (bVar11 = JsonLexer::Peek(lex,kArr), bVar11)))) {
                    ParseArray<google::protobuf::json_internal::ParseProto2Descriptor>
                              ((JsonLexer *)this,
                               (Field<google::protobuf::json_internal::ParseProto2Descriptor>)lex,
                               (Msg<google::protobuf::json_internal::ParseProto2Descriptor> *)
                               _Var17._M_value);
                  }
                  else {
                    ParseSingular<google::protobuf::json_internal::ParseProto2Descriptor>
                              ((JsonLexer *)this,
                               (Field<google::protobuf::json_internal::ParseProto2Descriptor>)lex,
                               (Msg<google::protobuf::json_internal::ParseProto2Descriptor> *)
                               _Var17._M_value);
                  }
                }
              }
              else {
                local_c0._0_8_ = &local_78;
                local_c0._8_8_ =
                     absl::lts_20240722::str_format_internal::FormatArgImpl::
                     Dispatch<std::basic_string_view<char,std::char_traits<char>>>;
                absl::lts_20240722::str_format_internal::FormatPack_abi_cxx11_
                          (&local_128,
                           "\'%s\' has already been set (either directly or as part of a oneof)",
                           0x41,local_c0);
                JsonLocation::Invalid((JsonLocation *)this,pJVar1,auStack_120._0_8_,local_128);
                if (local_128 !=
                    (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
                     )((long)auStack_120 + 8)) {
                  operator_delete((void *)local_128,(ulong)(auStack_120._8_8_ + 1));
                }
              }
              ppCVar23 = &(pMVar24->components_).
                          super__Vector_base<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
              *ppCVar23 = *ppCVar23 + -1;
            }
          }
          else {
            bVar11 = json_internal::operator==
                               ((MaybeOwnedString *)auStack_1a8,(char (*) [6])"@type");
            if (bVar11) {
              JsonLexer::SkipValue((JsonLexer *)this);
              if (*(long *)this == 1) {
                *(undefined8 *)this = 1;
              }
            }
            else {
              if (MVar14 == kNotWellKnown) goto LAB_002c3264;
              bVar11 = json_internal::operator==
                                 ((MaybeOwnedString *)auStack_1a8,(char (*) [6])0x3ec933);
              if (bVar11) {
                ParseMessage<google::protobuf::json_internal::ParseProto2Descriptor>
                          (this,lex,desc,msg,false);
              }
              else {
                JsonLocation::Invalid
                          ((JsonLocation *)this,pJVar1,0x37,
                           "fields in a well-known-typed Any must be @type or value");
              }
            }
          }
LAB_002c3614:
          if (*(long *)this == 1) {
            literal_00._M_str = ",";
            literal_00._M_len = 1;
            local_1d1 = JsonLexer::Peek(lex,literal_00);
            bVar11 = true;
            goto LAB_002c3642;
          }
          goto LAB_002c3637;
        }
        absl::lts_20240722::internal_statusor::Helper::Crash((Status *)local_1b0);
        goto LAB_002c41e5;
      }
    }
    else {
      if ((lex->options_).allow_legacy_syntax == true) {
        JsonLexer::ParseBareWord
                  ((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                    *)&local_128.status_,lex);
        absl::lts_20240722::internal_statusor::
        StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
        ::operator=((StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                     *)local_1b0,
                    (StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                     *)&local_128.status_);
        goto LAB_002c3149;
      }
      JsonLocation::Invalid((JsonLocation *)this,pJVar1,0xc,"expected \'\"\'");
    }
LAB_002c3637:
    bVar11 = false;
LAB_002c3642:
    absl::lts_20240722::internal_statusor::
    StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
    ::~StatusOrData((StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                     *)local_1b0);
    if (!bVar11) {
      return (Status)(uintptr_t)this;
    }
    literal_01._M_str = "}";
    literal_01._M_len = 1;
    bVar11 = JsonLexer::Peek(lex,literal_01);
    if (bVar11) goto LAB_002c3755;
    goto LAB_002c30e4;
  }
  if (MVar14 != kValue) {
    if (MVar14 == kStruct) {
      ParseStructValue<google::protobuf::json_internal::ParseProto2Descriptor>(this,lex,desc,msg);
      return (Status)(uintptr_t)this;
    }
    if (MVar14 == kAny) {
      JsonLexer::SkipToToken((JsonLexer *)this);
      if (*(long *)this != 1) {
        return (Status)(uintptr_t)this;
      }
      ZeroCopyBufferedStream::BeginMark((ZeroCopyBufferedStream *)&local_78);
      local_78.loc.offset._0_4_ = (undefined4)(lex->json_loc_).offset;
      local_78.loc.offset._4_4_ = *(undefined4 *)((long)&(lex->json_loc_).offset + 4);
      local_78.loc.line._0_4_ = (undefined4)(lex->json_loc_).line;
      local_78.loc.line._4_4_ = *(undefined4 *)((long)&(lex->json_loc_).line + 4);
      local_78.loc.col._0_4_ = (undefined4)(lex->json_loc_).col;
      local_78.loc.col._4_4_ = *(undefined4 *)((long)&(lex->json_loc_).col + 4);
      local_78.loc.path._0_4_ = *(undefined4 *)&(lex->json_loc_).path;
      local_78.loc.path._4_4_ = *(undefined4 *)((long)&(lex->json_loc_).path + 4);
      local_90 = false;
      JsonLexer::Expect((JsonLexer *)this,lex,1,"{");
      if (*(long *)this == 1) {
        pJVar1 = &lex->json_loc_;
        iVar15 = (lex->options_).recursion_depth;
        if (iVar15 == 0) {
          JsonLocation::Invalid
                    ((JsonLocation *)this,pJVar1,0x22,"JSON content was too deeply nested");
        }
        else {
          (lex->options_).recursion_depth = iVar15 + -1;
          *(undefined8 *)this = 1;
        }
        if (*(long *)this == 1) {
          literal_02._M_str = "}";
          literal_02._M_len = 1;
          bVar11 = JsonLexer::Peek(lex,literal_02);
          if (bVar11) {
            piVar2 = &(lex->options_).recursion_depth;
            *piVar2 = *piVar2 + 1;
          }
          else {
            bVar11 = true;
            local_1c0 = "expected \',\'";
            do {
              if (bVar11 == false) goto LAB_002c3a42;
              JsonLexer::SkipToToken((JsonLexer *)this);
              if (*(long *)this != 1) goto LAB_002c3a57;
              absl::lts_20240722::
              StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
              ::StatusOr((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                          *)&local_128.status_);
              cVar12 = ZeroCopyBufferedStream::PeekChar(&lex->stream_);
              if ((cVar12 == '\"') ||
                 (cVar12 = ZeroCopyBufferedStream::PeekChar(&lex->stream_), cVar12 == '\'')) {
                JsonLexer::ParseUtf8
                          ((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                            *)local_1b0,lex);
                absl::lts_20240722::internal_statusor::
                StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                ::operator=((StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                             *)&local_128.status_,
                            (StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                             *)local_1b0);
LAB_002c389e:
                absl::lts_20240722::internal_statusor::
                StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                ::~StatusOrData((StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                                 *)local_1b0);
                *(anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
                  *)this = local_128;
                if (((ulong)local_128 & 1) == 0) {
                  LOCK();
                  *(int *)local_128 = *(int *)local_128 + 1;
                  UNLOCK();
                }
                if ((*(long *)this != 1) ||
                   (JsonLexer::Expect((JsonLexer *)this,lex,1,":"), *(long *)this != 1))
                goto LAB_002c39ec;
                if (local_128 !=
                    (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
                     )0x1) goto LAB_002c41ff;
                bVar13 = json_internal::operator==
                                   ((MaybeOwnedString *)auStack_120,(char (*) [6])"@type");
                if (bVar13) {
                  if (local_90 == true) {
                    JsonLocation::Invalid
                              ((JsonLocation *)this,local_f0,0x15,"repeated @type in Any");
                  }
                  else {
                    JsonLexer::ParseUtf8
                              ((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                                *)local_1b0,lex);
                    *(undefined1 (*) [8])this = local_1b0;
                    if (((ulong)local_1b0 & 1) == 0) {
                      LOCK();
                      *(int *)local_1b0 = *(int *)local_1b0 + 1;
                      UNLOCK();
                    }
                    if ((anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
                         )local_1b0 ==
                        (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
                         )0x1) {
                      std::optional<google::protobuf::json_internal::MaybeOwnedString>::operator=
                                ((optional<google::protobuf::json_internal::MaybeOwnedString> *)
                                 local_c0,(MaybeOwnedString *)auStack_1a8);
                      *(undefined8 *)this = 1;
                    }
                    absl::lts_20240722::internal_statusor::
                    StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                    ::~StatusOrData((StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                                     *)local_1b0);
                  }
                }
                else {
                  JsonLexer::SkipValue((JsonLexer *)this);
                }
                if (*(long *)this != 1) goto LAB_002c39ec;
                literal_03._M_str = ",";
                literal_03._M_len = 1;
                bVar11 = JsonLexer::Peek(lex,literal_03);
                bVar13 = true;
              }
              else {
                if ((lex->options_).allow_legacy_syntax == true) {
                  JsonLexer::ParseBareWord
                            ((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                              *)local_1b0,lex);
                  absl::lts_20240722::internal_statusor::
                  StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                  ::operator=((StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                               *)&local_128.status_,
                              (StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                               *)local_1b0);
                  goto LAB_002c389e;
                }
                JsonLocation::Invalid((JsonLocation *)this,pJVar1,0xc,"expected \'\"\'");
LAB_002c39ec:
                bVar13 = false;
              }
              absl::lts_20240722::internal_statusor::
              StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
              ::~StatusOrData((StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                               *)&local_128.status_);
              if (!bVar13) goto LAB_002c3a57;
              literal_04._M_str = "}";
              literal_04._M_len = 1;
              bVar13 = JsonLexer::Peek(lex,literal_04);
            } while (!bVar13);
            piVar2 = &(lex->options_).recursion_depth;
            *piVar2 = *piVar2 + 1;
            if (((lex->options_).allow_legacy_syntax == false) && (bVar11 != false)) {
              local_1c0 = "expected \'}\'";
LAB_002c3a42:
              JsonLocation::Invalid((JsonLocation *)this,pJVar1,0xc,local_1c0);
              goto LAB_002c3a57;
            }
          }
          *(undefined8 *)this = 1;
        }
      }
LAB_002c3a57:
      if (*(long *)this == 1) {
        sVar5 = (local_78.value.guard_.owner_)->cursor_;
        auStack_1a8._36_4_ = (undefined4)((ulong)local_78.value.guard_.owner_ >> 0x20);
        if (local_78.value.guard_.owner_ != (ZeroCopyBufferedStream *)0x0) {
          iVar15 = (local_78.value.guard_.owner_)->outstanding_buffer_borrows_;
          uVar21 = iVar15 + 1;
          pcVar20 = (char *)(ulong)uVar21;
          (local_78.value.guard_.owner_)->outstanding_buffer_borrows_ = uVar21;
          if (iVar15 == 0) {
            (local_78.value.guard_.owner_)->buffer_start_ = sVar5;
          }
          (local_78.value.guard_.owner_)->outstanding_buffer_borrows_ = iVar15 + 2;
          if (uVar21 == 0) {
            (local_78.value.guard_.owner_)->buffer_start_ = sVar5;
          }
        }
        auStack_1a8._8_8_ = (char *)(sVar5 - local_78.value.offset_);
        auStack_1a8._0_8_ = local_78.value.offset_;
        auStack_1a8._32_4_ = SUB84(local_78.value.guard_.owner_,0);
        auStack_1a8[0x18] = 1;
        if (local_78.value.guard_.owner_ != (ZeroCopyBufferedStream *)0x0) {
          ZeroCopyBufferedStream::DownRefBuffer(local_78.value.guard_.owner_);
        }
        sVar27 = MaybeOwnedString::AsView((MaybeOwnedString *)local_1b0);
        if ((ZeroCopyBufferedStream *)CONCAT44(auStack_1a8._36_4_,auStack_1a8._32_4_) !=
            (ZeroCopyBufferedStream *)0x0) {
          ZeroCopyBufferedStream::DownRefBuffer
                    ((ZeroCopyBufferedStream *)CONCAT44(auStack_1a8._36_4_,auStack_1a8._32_4_));
          auStack_1a8._32_4_ = 0;
          auStack_1a8._36_4_ = 0;
        }
        (*std::__detail::__variant::
          __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::json_internal::MaybeOwnedString::StreamOwned>_&>
          ::_S_vtable._M_arr[(byte)auStack_1a8[0x18]]._M_data)
                  ((anon_class_1_0_00000001 *)&local_128.status_,
                   (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::json_internal::MaybeOwnedString::StreamOwned>
                    *)local_1b0);
        io::ArrayInputStream::ArrayInputStream
                  ((ArrayInputStream *)&local_128.status_,sVar27._M_str,(int)sVar27._M_len,-1);
        pMStack_138 = lex->path_;
        local_150 = CONCAT44(local_78.loc.offset._4_4_,(undefined4)local_78.loc.offset);
        sStack_148 = CONCAT44(local_78.loc.line._4_4_,(undefined4)local_78.loc.line);
        local_140 = (undefined4)local_78.loc.col;
        uStack_13c = local_78.loc.col._4_4_;
        auStack_1a8._68_4_ = 0;
        auStack_1a8._0_16_ = ZEXT816(0);
        auStack_1a8._16_8_ = (pointer)0x0;
        auStack_1a8[0x18] = 0;
        auStack_1a8._25_7_ = 0;
        auStack_1a8._32_4_ = 0;
        auStack_1a8._36_4_ = 0;
        auStack_1a8[0x28] = false;
        auStack_1a8._48_8_ = 0;
        auStack_1a8._56_8_ = 0;
        auStack_1a8[0x40] = false;
        auStack_1a8._72_8_ = *(undefined8 *)&lex->options_;
        auStack_1a8[0x50] = (lex->options_).allow_legacy_syntax;
        auStack_1a8._81_3_ = *(undefined3 *)&(lex->options_).field_0x9;
        local_1b0 = (undefined1  [8])&local_128;
        local_130 = pMStack_138;
        if (local_90 == false) {
          if ((lex->options_).allow_legacy_syntax == false) {
            JsonLocation::Invalid((JsonLocation *)this,&local_78.loc,0x14,"missing @type in Any");
          }
          else {
            if ((lex->options_).allow_legacy_syntax == false) goto LAB_002c420c;
            JsonLexer::
            VisitObject<google::protobuf::json_internal::(anonymous_namespace)::ParseAny<google::protobuf::json_internal::ParseProto2Descriptor>(google::protobuf::json_internal::JsonLexer&,google::protobuf::json_internal::ParseProto2Descriptor::Desc_const&,google::protobuf::json_internal::ParseProto2Descriptor::Msg&)::_lambda(auto:1&)_1_>
                      ((JsonLexer *)this,
                       (LocationWith<google::protobuf::json_internal::Mark> *)local_1b0);
            if (*(long *)this == 1) {
              absl::lts_20240722::Status::~Status((Status *)this);
              *(undefined8 *)this = 1;
            }
          }
        }
        else {
          pFVar18 = Proto2Descriptor::MustHaveField(desc,1);
          sVar27 = MaybeOwnedString::AsView((MaybeOwnedString *)local_c0);
          x._M_str = pcVar20;
          x._M_len = (size_t)sVar27._M_str;
          ParseProto2Descriptor::SetString
                    ((ParseProto2Descriptor *)pFVar18,(Field)msg,(Msg *)sVar27._M_len,x);
          pFVar18 = Proto2Descriptor::MustHaveField(desc,2);
          psVar16 = MaybeOwnedString::ToString_abi_cxx11_((MaybeOwnedString *)local_c0);
          ParseProto2Descriptor::
          NewDynamic<google::protobuf::json_internal::(anonymous_namespace)::ParseAny<google::protobuf::json_internal::ParseProto2Descriptor>(google::protobuf::json_internal::JsonLexer&,google::protobuf::json_internal::ParseProto2Descriptor::Desc_const&,google::protobuf::json_internal::ParseProto2Descriptor::Msg&)::_lambda(google::protobuf::Descriptor_const&,google::protobuf::json_internal::ParseProto2Descriptor::Msg&)_1_>
                    ((ParseProto2Descriptor *)this,pFVar18,psVar16,msg,(JsonLexer *)local_1b0);
        }
        if ((pointer)auStack_1a8._16_8_ != (pointer)0x0) {
          operator_delete((void *)auStack_1a8._16_8_,
                          CONCAT44(auStack_1a8._36_4_,auStack_1a8._32_4_) - auStack_1a8._16_8_);
        }
      }
      if (local_90 == true) {
        std::_Optional_payload_base<google::protobuf::json_internal::MaybeOwnedString>::_M_destroy
                  ((_Optional_payload_base<google::protobuf::json_internal::MaybeOwnedString> *)
                   local_c0);
      }
      if (local_78.value.guard_.owner_ == (ZeroCopyBufferedStream *)0x0) {
        return (Status)(uintptr_t)this;
      }
      ZeroCopyBufferedStream::DownRefBuffer(local_78.value.guard_.owner_);
      return (Status)(uintptr_t)this;
    }
    JsonLexer::PeekKind((JsonLexer *)local_1b0);
    auVar8 = local_1b0;
    uVar22 = auStack_1a8._0_4_;
    absl::lts_20240722::internal_statusor::
    StatusOrData<google::protobuf::json_internal::JsonLexer::Kind>::~StatusOrData
              ((StatusOrData<google::protobuf::json_internal::JsonLexer::Kind> *)local_1b0);
    if ((((anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
           )auVar8 !=
          (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
           )0x1) || (uVar22 != 0)) || ((lex->options_).allow_legacy_syntax == false)) {
      switch(MVar14) {
      case kWrapper:
        pFVar18 = Proto2Descriptor::MustHaveField(desc,1);
        ParseSingular<google::protobuf::json_internal::ParseProto2Descriptor>
                  ((JsonLexer *)this,
                   (Field<google::protobuf::json_internal::ParseProto2Descriptor>)lex,
                   (Msg<google::protobuf::json_internal::ParseProto2Descriptor> *)pFVar18);
        return (Status)(uintptr_t)this;
      case kList:
        ParseListValue<google::protobuf::json_internal::ParseProto2Descriptor>(this,lex,desc,msg);
        return (Status)(uintptr_t)this;
      case kTimestamp:
        ParseTimestamp<google::protobuf::json_internal::ParseProto2Descriptor>
                  ((JsonLexer *)this,
                   (Desc<google::protobuf::json_internal::ParseProto2Descriptor> *)lex,
                   (Msg<google::protobuf::json_internal::ParseProto2Descriptor> *)desc);
        return (Status)(uintptr_t)this;
      case kDuration:
        ParseDuration<google::protobuf::json_internal::ParseProto2Descriptor>(this,lex,desc,msg);
        return (Status)(uintptr_t)this;
      case kFieldMask:
        ParseFieldMask<google::protobuf::json_internal::ParseProto2Descriptor>
                  ((JsonLexer *)this,
                   (Desc<google::protobuf::json_internal::ParseProto2Descriptor> *)lex,
                   (Msg<google::protobuf::json_internal::ParseProto2Descriptor> *)desc);
        return (Status)(uintptr_t)this;
      }
    }
    goto switchD_002c3056_caseD_3;
  }
  SVar25 = JsonLexer::PeekKind((JsonLexer *)&local_128.status_);
  uVar19 = SVar25.super_StatusOrData<google::protobuf::json_internal::JsonLexer::Kind>._8_8_;
  *(anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
    *)this = local_128;
  if (((ulong)local_128 & 1) == 0) {
    LOCK();
    *(int *)local_128 = *(int *)local_128 + 1;
    UNLOCK();
  }
  if (*(long *)this != 1) goto LAB_002c41b9;
  if (local_128 !=
      (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
       )0x1) {
LAB_002c41e5:
    absl::lts_20240722::internal_statusor::Helper::Crash(&local_128.status_);
LAB_002c41f2:
    absl::lts_20240722::internal_statusor::Helper::Crash(&local_128.status_);
LAB_002c41ff:
    absl::lts_20240722::internal_statusor::Helper::Crash(&local_128.status_);
LAB_002c420c:
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_88,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/json/internal/parser.cc"
               ,0x3f7,0x21,"lex.options().allow_legacy_syntax");
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_88);
  }
  switch(auStack_120._0_4_) {
  case 0:
    pFVar18 = Proto2Descriptor::MustHaveField(desc,5,uVar19);
    pMVar24 = lex->path_;
    pcVar20 = (pFVar18->all_names_->_M_dataplus)._M_p;
    pcVar7 = (pointer)pFVar18->all_names_->_M_string_length;
    bVar3 = pFVar18->type_;
    auStack_1a8._0_16_ = (undefined1  [16])Proto2Descriptor::FieldTypeName(pFVar18);
    local_1b0._1_3_ = 0;
    local_1b0[0] = bVar3;
    auStack_1a8[0x18] = SUB81(pcVar20,0);
    auStack_1a8._25_7_ = (undefined7)((ulong)pcVar20 >> 8);
    auStack_1a8._32_4_ = 0xffffffff;
    iVar4._M_current =
         (pMVar24->components_).
         super__Vector_base<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    auStack_1a8._16_8_ = pcVar7;
    if (iVar4._M_current ==
        (pMVar24->components_).
        super__Vector_base<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
      ::_M_realloc_insert<google::protobuf::json_internal::MessagePath::Component>
                (&pMVar24->components_,iVar4,(Component *)local_1b0);
    }
    else {
      ((iVar4._M_current)->field_name)._M_str = pcVar20;
      *(ulong *)&(iVar4._M_current)->repeated_index = CONCAT44(auStack_1a8._36_4_,0xffffffff);
      ((iVar4._M_current)->type_name)._M_str = (char *)auStack_1a8._8_8_;
      ((iVar4._M_current)->field_name)._M_len = (size_t)pcVar7;
      *(undefined1 (*) [8])iVar4._M_current = local_1b0;
      ((iVar4._M_current)->type_name)._M_len = auStack_1a8._0_8_;
      ppCVar23 = &(pMVar24->components_).
                  super__Vector_base<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *ppCVar23 = *ppCVar23 + 1;
    }
    ParseProto2Descriptor::
    NewMsg<google::protobuf::json_internal::(anonymous_namespace)::ParseValue<google::protobuf::json_internal::ParseProto2Descriptor>(google::protobuf::json_internal::JsonLexer&,google::protobuf::json_internal::ParseProto2Descriptor::Desc_const&,google::protobuf::json_internal::ParseProto2Descriptor::Msg&)::_lambda(auto:1&,auto:2&)_1_>
              ((ParseProto2Descriptor *)this,pFVar18,msg,(anon_class_8_1_ba1d5d7f)lex);
    goto LAB_002c415c;
  case 1:
    pFVar18 = Proto2Descriptor::MustHaveField(desc,6,uVar19);
    pMVar24 = lex->path_;
    pcVar20 = (pFVar18->all_names_->_M_dataplus)._M_p;
    pcVar7 = (pointer)pFVar18->all_names_->_M_string_length;
    bVar3 = pFVar18->type_;
    auStack_1a8._0_16_ = (undefined1  [16])Proto2Descriptor::FieldTypeName(pFVar18);
    local_1b0._1_3_ = 0;
    local_1b0[0] = bVar3;
    auStack_1a8[0x18] = SUB81(pcVar20,0);
    auStack_1a8._25_7_ = (undefined7)((ulong)pcVar20 >> 8);
    auStack_1a8._32_4_ = 0xffffffff;
    iVar4._M_current =
         (pMVar24->components_).
         super__Vector_base<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    auStack_1a8._16_8_ = pcVar7;
    if (iVar4._M_current ==
        (pMVar24->components_).
        super__Vector_base<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
      ::_M_realloc_insert<google::protobuf::json_internal::MessagePath::Component>
                (&pMVar24->components_,iVar4,(Component *)local_1b0);
    }
    else {
      ((iVar4._M_current)->field_name)._M_str = pcVar20;
      *(ulong *)&(iVar4._M_current)->repeated_index = CONCAT44(auStack_1a8._36_4_,0xffffffff);
      ((iVar4._M_current)->type_name)._M_str = (char *)auStack_1a8._8_8_;
      ((iVar4._M_current)->field_name)._M_len = (size_t)pcVar7;
      *(undefined1 (*) [8])iVar4._M_current = local_1b0;
      ((iVar4._M_current)->type_name)._M_len = auStack_1a8._0_8_;
      ppCVar23 = &(pMVar24->components_).
                  super__Vector_base<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *ppCVar23 = *ppCVar23 + 1;
    }
    ParseProto2Descriptor::
    NewMsg<google::protobuf::json_internal::(anonymous_namespace)::ParseValue<google::protobuf::json_internal::ParseProto2Descriptor>(google::protobuf::json_internal::JsonLexer&,google::protobuf::json_internal::ParseProto2Descriptor::Desc_const&,google::protobuf::json_internal::ParseProto2Descriptor::Msg&)::_lambda(auto:1&,auto:2&)_2_>
              ((ParseProto2Descriptor *)this,pFVar18,msg,(anon_class_8_1_ba1d5d7f)lex);
LAB_002c415c:
    ppCVar23 = &(pMVar24->components_).
                super__Vector_base<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *ppCVar23 = *ppCVar23 + -1;
    goto LAB_002c41b9;
  case 2:
    pFVar18 = Proto2Descriptor::MustHaveField(desc,3,uVar19);
    pMVar24 = lex->path_;
    pcVar6 = (pFVar18->all_names_->_M_dataplus)._M_p;
    pcVar7 = (pointer)pFVar18->all_names_->_M_string_length;
    bVar3 = pFVar18->type_;
    auStack_1a8._0_16_ = (undefined1  [16])Proto2Descriptor::FieldTypeName(pFVar18);
    local_1b0._1_3_ = 0;
    local_1b0[0] = bVar3;
    auStack_1a8[0x18] = SUB81(pcVar6,0);
    auStack_1a8._25_7_ = (undefined7)((ulong)pcVar6 >> 8);
    auStack_1a8._32_4_ = 0xffffffff;
    ppCVar23 = &(pMVar24->components_).
                super__Vector_base<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    iVar4._M_current =
         (pMVar24->components_).
         super__Vector_base<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    auStack_1a8._16_8_ = pcVar7;
    if (iVar4._M_current ==
        (pMVar24->components_).
        super__Vector_base<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
      ::_M_realloc_insert<google::protobuf::json_internal::MessagePath::Component>
                (&pMVar24->components_,iVar4,(Component *)local_1b0);
    }
    else {
      ((iVar4._M_current)->field_name)._M_str = pcVar6;
      *(ulong *)&(iVar4._M_current)->repeated_index = CONCAT44(auStack_1a8._36_4_,0xffffffff);
      ((iVar4._M_current)->type_name)._M_str = (char *)auStack_1a8._8_8_;
      ((iVar4._M_current)->field_name)._M_len = (size_t)pcVar7;
      *(undefined1 (*) [8])iVar4._M_current = local_1b0;
      ((iVar4._M_current)->type_name)._M_len = auStack_1a8._0_8_;
      *ppCVar23 = *ppCVar23 + 1;
    }
    JsonLexer::ParseUtf8
              ((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                *)local_1b0,lex);
    *(undefined1 (*) [8])this = local_1b0;
    if (((ulong)local_1b0 & 1) == 0) {
      LOCK();
      *(int *)local_1b0 = *(int *)local_1b0 + 1;
      UNLOCK();
    }
    if (*(long *)this != 1) {
      absl::lts_20240722::internal_statusor::
      StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
      ::~StatusOrData((StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                       *)local_1b0);
LAB_002c41b4:
      *ppCVar23 = *ppCVar23 + -1;
      goto LAB_002c41b9;
    }
    absl::lts_20240722::Status::~Status((Status *)this);
    if ((anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
         )local_1b0 !=
        (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
         )0x1) {
      absl::lts_20240722::internal_statusor::Helper::Crash((Status *)local_1b0);
LAB_002c4248:
      absl::lts_20240722::internal_statusor::Helper::Crash((Status *)local_1b0);
      uVar19 = absl::lts_20240722::internal_statusor::Helper::Crash((Status *)local_1b0);
      absl::lts_20240722::internal_statusor::
      StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
      ::~StatusOrData((StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                       *)local_1b0);
      absl::lts_20240722::internal_statusor::
      StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
      ::~StatusOrData((StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                       *)&local_128.status_);
      if (local_90 == true) {
        std::_Optional_payload_base<google::protobuf::json_internal::MaybeOwnedString>::_M_destroy
                  ((_Optional_payload_base<google::protobuf::json_internal::MaybeOwnedString> *)
                   local_c0);
      }
      LocationWith<google::protobuf::json_internal::Mark>::~LocationWith(&local_78);
      _Unwind_Resume(uVar19);
    }
    psVar16 = MaybeOwnedString::ToString_abi_cxx11_((MaybeOwnedString *)auStack_1a8);
    x_00._M_str = pcVar20;
    x_00._M_len = (size_t)(psVar16->_M_dataplus)._M_p;
    ParseProto2Descriptor::SetString
              ((ParseProto2Descriptor *)pFVar18,(Field)msg,(Msg *)psVar16->_M_string_length,x_00);
    absl::lts_20240722::internal_statusor::
    StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
    ::~StatusOrData((StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                     *)local_1b0);
    break;
  case 3:
    pFVar18 = Proto2Descriptor::MustHaveField(desc,2,uVar19);
    pMVar24 = lex->path_;
    pcVar20 = (pFVar18->all_names_->_M_dataplus)._M_p;
    pcVar7 = (pointer)pFVar18->all_names_->_M_string_length;
    bVar3 = pFVar18->type_;
    auStack_1a8._0_16_ = (undefined1  [16])Proto2Descriptor::FieldTypeName(pFVar18);
    local_1b0._1_3_ = 0;
    local_1b0[0] = bVar3;
    auStack_1a8[0x18] = SUB81(pcVar20,0);
    auStack_1a8._25_7_ = (undefined7)((ulong)pcVar20 >> 8);
    auStack_1a8._32_4_ = 0xffffffff;
    ppCVar23 = &(pMVar24->components_).
                super__Vector_base<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    iVar4._M_current =
         (pMVar24->components_).
         super__Vector_base<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    auStack_1a8._16_8_ = pcVar7;
    if (iVar4._M_current ==
        (pMVar24->components_).
        super__Vector_base<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
      ::_M_realloc_insert<google::protobuf::json_internal::MessagePath::Component>
                (&pMVar24->components_,iVar4,(Component *)local_1b0);
    }
    else {
      ((iVar4._M_current)->field_name)._M_str = pcVar20;
      *(ulong *)&(iVar4._M_current)->repeated_index = CONCAT44(auStack_1a8._36_4_,0xffffffff);
      ((iVar4._M_current)->type_name)._M_str = (char *)auStack_1a8._8_8_;
      ((iVar4._M_current)->field_name)._M_len = (size_t)pcVar7;
      *(undefined1 (*) [8])iVar4._M_current = local_1b0;
      ((iVar4._M_current)->type_name)._M_len = auStack_1a8._0_8_;
      *ppCVar23 = *ppCVar23 + 1;
    }
    JsonLexer::ParseNumber
              ((StatusOr<google::protobuf::json_internal::LocationWith<double>_> *)local_1b0,lex);
    *(undefined1 (*) [8])this = local_1b0;
    if (((ulong)local_1b0 & 1) == 0) {
      LOCK();
      *(int *)local_1b0 = *(int *)local_1b0 + 1;
      UNLOCK();
    }
    if (*(long *)this != 1) {
      absl::lts_20240722::internal_statusor::
      StatusOrData<google::protobuf::json_internal::LocationWith<double>_>::~StatusOrData
                ((StatusOrData<google::protobuf::json_internal::LocationWith<double>_> *)local_1b0);
      goto LAB_002c41b4;
    }
    absl::lts_20240722::Status::~Status((Status *)this);
    if ((anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
         )local_1b0 !=
        (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
         )0x1) goto LAB_002c4248;
    ParseProto2Descriptor::SetDouble(pFVar18,msg,(double)auStack_1a8._0_8_);
    absl::lts_20240722::internal_statusor::
    StatusOrData<google::protobuf::json_internal::LocationWith<double>_>::~StatusOrData
              ((StatusOrData<google::protobuf::json_internal::LocationWith<double>_> *)local_1b0);
    break;
  case 4:
  case 5:
    pFVar18 = Proto2Descriptor::MustHaveField(desc,4,uVar19);
    pMVar24 = lex->path_;
    pcVar20 = (pFVar18->all_names_->_M_dataplus)._M_p;
    pcVar7 = (pointer)pFVar18->all_names_->_M_string_length;
    bVar3 = pFVar18->type_;
    auStack_1a8._0_16_ = (undefined1  [16])Proto2Descriptor::FieldTypeName(pFVar18);
    local_1b0._0_4_ = CONCAT31(0,bVar3);
    auStack_1a8[0x18] = SUB81(pcVar20,0);
    auStack_1a8._25_7_ = (undefined7)((ulong)pcVar20 >> 8);
    auStack_1a8._32_4_ = 0xffffffff;
    ppCVar23 = &(pMVar24->components_).
                super__Vector_base<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    iVar4._M_current =
         (pMVar24->components_).
         super__Vector_base<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    auStack_1a8._16_8_ = pcVar7;
    if (iVar4._M_current ==
        (pMVar24->components_).
        super__Vector_base<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
      ::_M_realloc_insert<google::protobuf::json_internal::MessagePath::Component>
                (&pMVar24->components_,iVar4,(Component *)local_1b0);
    }
    else {
      ((iVar4._M_current)->field_name)._M_str = pcVar20;
      *(ulong *)&(iVar4._M_current)->repeated_index = CONCAT44(auStack_1a8._36_4_,0xffffffff);
      ((iVar4._M_current)->type_name)._M_str = (char *)auStack_1a8._8_8_;
      ((iVar4._M_current)->field_name)._M_len = (size_t)pcVar7;
      (iVar4._M_current)->type = local_1b0._0_4_;
      *(undefined4 *)&(iVar4._M_current)->field_0x4 = local_1b0._4_4_;
      *(undefined4 *)&((iVar4._M_current)->type_name)._M_len = auStack_1a8._0_4_;
      *(undefined4 *)((long)&((iVar4._M_current)->type_name)._M_len + 4) = auStack_1a8._4_4_;
      *ppCVar23 = *ppCVar23 + 1;
    }
    if (local_128 !=
        (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
         )0x1) goto LAB_002c41f2;
    if (auStack_120._0_4_ == 4) {
      JsonLexer::Expect((JsonLexer *)this,lex,4,"true");
    }
    else {
      JsonLexer::Expect((JsonLexer *)this,lex,5,"false");
    }
    if (*(long *)this != 1) goto LAB_002c41b4;
    absl::lts_20240722::Status::~Status((Status *)this);
    ParseProto2Descriptor::SetBool(pFVar18,msg,auStack_120._0_4_ == 4);
    break;
  case 6:
    pFVar18 = Proto2Descriptor::MustHaveField(desc,1,uVar19);
    pMVar24 = lex->path_;
    pcVar20 = (pFVar18->all_names_->_M_dataplus)._M_p;
    pcVar7 = (pointer)pFVar18->all_names_->_M_string_length;
    bVar3 = pFVar18->type_;
    auStack_1a8._0_16_ = (undefined1  [16])Proto2Descriptor::FieldTypeName(pFVar18);
    local_1b0._0_4_ = CONCAT31(0,bVar3);
    auStack_1a8[0x18] = SUB81(pcVar20,0);
    auStack_1a8._25_7_ = (undefined7)((ulong)pcVar20 >> 8);
    auStack_1a8._32_4_ = 0xffffffff;
    ppCVar23 = &(pMVar24->components_).
                super__Vector_base<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    iVar4._M_current =
         (pMVar24->components_).
         super__Vector_base<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    auStack_1a8._16_8_ = pcVar7;
    if (iVar4._M_current ==
        (pMVar24->components_).
        super__Vector_base<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
      ::_M_realloc_insert<google::protobuf::json_internal::MessagePath::Component>
                (&pMVar24->components_,iVar4,(Component *)local_1b0);
    }
    else {
      ((iVar4._M_current)->field_name)._M_str = pcVar20;
      *(ulong *)&(iVar4._M_current)->repeated_index = CONCAT44(auStack_1a8._36_4_,0xffffffff);
      ((iVar4._M_current)->type_name)._M_str = (char *)auStack_1a8._8_8_;
      ((iVar4._M_current)->field_name)._M_len = (size_t)pcVar7;
      (iVar4._M_current)->type = local_1b0._0_4_;
      *(undefined4 *)&(iVar4._M_current)->field_0x4 = local_1b0._4_4_;
      *(undefined4 *)&((iVar4._M_current)->type_name)._M_len = auStack_1a8._0_4_;
      *(undefined4 *)((long)&((iVar4._M_current)->type_name)._M_len + 4) = auStack_1a8._4_4_;
      *ppCVar23 = *ppCVar23 + 1;
    }
    JsonLexer::Expect((JsonLexer *)this,lex,4,"null");
    if (*(long *)this != 1) goto LAB_002c41b4;
    absl::lts_20240722::Status::~Status((Status *)this);
    ParseProto2Descriptor::SetEnum(pFVar18,msg,0);
    break;
  default:
    goto switchD_002c2f74_default;
  }
  *ppCVar23 = *ppCVar23 + -1;
switchD_002c2f74_default:
  *(undefined8 *)this = 1;
LAB_002c41b9:
  absl::lts_20240722::internal_statusor::
  StatusOrData<google::protobuf::json_internal::JsonLexer::Kind>::~StatusOrData
            ((StatusOrData<google::protobuf::json_internal::JsonLexer::Kind> *)&local_128.status_);
  return (Status)(uintptr_t)this;
LAB_002c3755:
  piVar2 = &(lex->options_).recursion_depth;
  *piVar2 = *piVar2 + 1;
  if (((lex->options_).allow_legacy_syntax == false) && (local_1d1 != false)) {
    pcVar20 = "expected \'}\'";
LAB_002c373e:
    JsonLocation::Invalid((JsonLocation *)this,pJVar1,0xc,pcVar20);
    return (Status)(uintptr_t)this;
  }
  goto LAB_002c30bd;
}

Assistant:

absl::Status ParseMessage(JsonLexer& lex, const Desc<Traits>& desc,
                          Msg<Traits>& msg, bool any_reparse) {
  MessageType type = ClassifyMessage(Traits::TypeName(desc));
  if (!any_reparse) {
    switch (type) {
      case MessageType::kAny:
        return ParseAny<Traits>(lex, desc, msg);
      case MessageType::kValue:
        return ParseValue<Traits>(lex, desc, msg);
      case MessageType::kStruct:
        return ParseStructValue<Traits>(lex, desc, msg);
      default:
        break;
    }
    // For some types, the ESF parser permits parsing the "non-special" version.
    // It is not clear if this counts as out-of-spec, but we're treating it as
    // such.
    bool is_upcoming_object = lex.Peek(JsonLexer::kObj);
    if (!(is_upcoming_object && lex.options().allow_legacy_syntax)) {
      switch (type) {
        case MessageType::kList:
          return ParseListValue<Traits>(lex, desc, msg);
        case MessageType::kWrapper: {
          return ParseSingular<Traits>(lex, Traits::MustHaveField(desc, 1),
                                       msg);
        }
        case MessageType::kTimestamp:
          return ParseTimestamp<Traits>(lex, desc, msg);
        case MessageType::kDuration:
          return ParseDuration<Traits>(lex, desc, msg);
        case MessageType::kFieldMask:
          return ParseFieldMask<Traits>(lex, desc, msg);
        default:
          break;
      }
    }
  }

  return lex.VisitObject(
      [&](LocationWith<MaybeOwnedString>& name) -> absl::Status {
        // If this is a well-known type, we expect its contents to be inside
        // of a JSON field named "value".
        if (any_reparse) {
          if (name.value == "@type") {
            RETURN_IF_ERROR(lex.SkipValue());
            return absl::OkStatus();
          }
          if (type != MessageType::kNotWellKnown) {
            if (name.value != "value") {
              return lex.Invalid(
                  "fields in a well-known-typed Any must be @type or value");
            }
            // Parse the upcoming value as the message itself. This is *not*
            // an Any reparse because we do not expect to see @type in the
            // upcoming value.
            return ParseMessage<Traits>(lex, desc, msg,
                                        /*any_reparse=*/false);
          }
        }

        return ParseField<Traits>(lex, desc, name.value.ToString(), msg);
      });
}